

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O1

qreal __thiscall QWidget::windowOpacity(QWidget *this)

{
  long lVar1;
  qreal qVar2;
  
  qVar2 = 1.0;
  if (((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
      (lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78), lVar1 != 0)) &&
     (*(long *)(lVar1 + 8) != 0)) {
    qVar2 = (double)*(byte *)(*(long *)(lVar1 + 8) + 0xe0) / 255.0;
  }
  return qVar2;
}

Assistant:

inline Qt::WindowType QWidget::windowType() const
{ return static_cast<Qt::WindowType>((data->window_flags & Qt::WindowType_Mask).toInt()); }